

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::BasicGraphicsTestInstance::buildFrameBuffer
          (BasicGraphicsTestInstance *this,UVec2 *renderSize,VkFormat colorFormat,
          VkFormat depthFormat)

{
  deUint64 dVar1;
  VkDevice device;
  DeviceInterface *vk;
  VkImageViewType VVar2;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_f8;
  VkFormat local_cc;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_c8;
  UVec2 *local_a8;
  VkDevice local_a0;
  undefined1 local_98 [24];
  VkImage VStack_80;
  VkImageViewType local_78;
  VkFormat local_74;
  VkImageView *local_70;
  undefined8 uStack_68;
  VkImageSubresourceRange local_60;
  VkImageView attachmentBindInfos [2];
  
  vk = Context::getDeviceInterface((this->super_TimestampTestInstance).super_TestInstance.m_context)
  ;
  local_a0 = Context::getDevice((this->super_TimestampTestInstance).super_TestInstance.m_context);
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&local_f8,&this->super_TimestampTestInstance,
             colorFormat,renderSize->m_data[0],renderSize->m_data[1],0x11,VK_SAMPLE_COUNT_1_BIT,
             &this->m_colorImageAlloc);
  local_98._16_8_ = local_f8.m_data.deleter.m_device;
  VStack_80.m_internal = (deUint64)local_f8.m_data.deleter.m_allocator;
  local_98._0_8_ = local_f8.m_data.object.m_internal;
  local_98._8_8_ = local_f8.m_data.deleter.m_deviceIface;
  local_f8.m_data.object.m_internal = 0;
  local_f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)local_98._16_8_;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_80.m_internal;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       local_98._0_8_;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_98._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_f8);
  local_cc = depthFormat;
  local_a8 = renderSize;
  TimestampTestInstance::createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&local_f8,&this->super_TimestampTestInstance,
             depthFormat,renderSize->m_data[0],renderSize->m_data[1],0x20,VK_SAMPLE_COUNT_1_BIT,
             &this->m_depthImageAlloc);
  local_98._16_8_ = local_f8.m_data.deleter.m_device;
  VStack_80.m_internal = (deUint64)local_f8.m_data.deleter.m_allocator;
  local_98._0_8_ = local_f8.m_data.object.m_internal;
  local_98._8_8_ = local_f8.m_data.deleter.m_deviceIface;
  local_f8.m_data.object.m_internal = 0;
  local_f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)local_98._16_8_;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_80.m_internal;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       local_98._0_8_;
  (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_98._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_f8);
  device = local_a0;
  VStack_80.m_internal =
       (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  dVar1 = (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
          m_internal;
  this->m_imageLayoutBarriers[0].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[0].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[0].srcAccessMask = 0;
  this->m_imageLayoutBarriers[0].dstAccessMask = 0x100;
  this->m_imageLayoutBarriers[0].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[0].newLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[0].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[0].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[0].image.m_internal = VStack_80.m_internal;
  this->m_imageLayoutBarriers[0].subresourceRange.aspectMask = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[0].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseArrayLayer = 0;
  VVar2 = VK_IMAGE_VIEW_TYPE_2D;
  this->m_imageLayoutBarriers[0].subresourceRange.layerCount = 1;
  this->m_imageLayoutBarriers[1].sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  this->m_imageLayoutBarriers[1].pNext = (void *)0x0;
  this->m_imageLayoutBarriers[1].srcAccessMask = 0;
  this->m_imageLayoutBarriers[1].dstAccessMask = 0x400;
  this->m_imageLayoutBarriers[1].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[1].newLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  this->m_imageLayoutBarriers[1].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[1].image.m_internal = dVar1;
  this->m_imageLayoutBarriers[1].subresourceRange.aspectMask = 2;
  this->m_imageLayoutBarriers[1].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[1].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[1].subresourceRange.layerCount = 1;
  local_98._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_98._8_8_ = (void *)0x0;
  local_98._16_8_ = local_98._16_8_ & 0xffffffff00000000;
  local_70 = (VkImageView *)0x400000003;
  uStack_68._0_4_ = VK_COMPONENT_SWIZZLE_B;
  uStack_68._4_4_ = VK_COMPONENT_SWIZZLE_A;
  local_60.aspectMask = 1;
  local_60.baseMipLevel = 0;
  local_60.levelCount = 1;
  local_60.baseArrayLayer = 0;
  local_78 = VVar2;
  local_74 = colorFormat;
  local_60.layerCount = VVar2;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&local_c8,vk,local_a0,
             (VkImageViewCreateInfo *)local_98,(VkAllocationCallbacks *)0x0);
  local_f8.m_data.deleter.m_device = local_c8.m_data.deleter.m_device;
  local_f8.m_data.deleter.m_allocator = local_c8.m_data.deleter.m_allocator;
  local_f8.m_data.object.m_internal = local_c8.m_data.object.m_internal;
  local_f8.m_data.deleter.m_deviceIface = local_c8.m_data.deleter.m_deviceIface;
  local_c8.m_data.object.m_internal = 0;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&(this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = local_f8.m_data.deleter.m_device;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = local_f8.m_data.deleter.m_allocator;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = local_f8.m_data.object.m_internal;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = local_f8.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_c8);
  local_98._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_98._8_8_ = (void *)0x0;
  local_98._16_8_ = local_98._16_8_ & 0xffffffff00000000;
  VStack_80.m_internal =
       (this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_74 = local_cc;
  local_70 = (VkImageView *)0x400000003;
  uStack_68._0_4_ = VK_COMPONENT_SWIZZLE_B;
  uStack_68._4_4_ = VK_COMPONENT_SWIZZLE_A;
  local_60.aspectMask = 2;
  local_60.baseMipLevel = 0;
  local_60.levelCount = 1;
  local_60.baseArrayLayer = 0;
  local_78 = VVar2;
  local_60.layerCount = VVar2;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&local_c8,vk,device,
             (VkImageViewCreateInfo *)local_98,(VkAllocationCallbacks *)0x0);
  local_f8.m_data.deleter.m_device = local_c8.m_data.deleter.m_device;
  local_f8.m_data.deleter.m_allocator = local_c8.m_data.deleter.m_allocator;
  local_f8.m_data.object.m_internal = local_c8.m_data.object.m_internal;
  local_f8.m_data.deleter.m_deviceIface = local_c8.m_data.deleter.m_deviceIface;
  local_c8.m_data.object.m_internal = 0;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&(this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = local_f8.m_data.deleter.m_device;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = local_f8.m_data.deleter.m_allocator;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = local_f8.m_data.object.m_internal;
  (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = local_f8.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_c8);
  attachmentBindInfos[0].m_internal =
       (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  local_70 = attachmentBindInfos;
  attachmentBindInfos[1].m_internal =
       (this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  local_98._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_98._8_8_ = (void *)0x0;
  local_98._16_8_ = local_98._16_8_ & 0xffffffff00000000;
  VStack_80.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_78 = VK_IMAGE_VIEW_TYPE_3D;
  uStack_68 = *(undefined8 *)local_a8->m_data;
  local_60.aspectMask = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&local_c8,vk,device,
             (VkFramebufferCreateInfo *)local_98,(VkAllocationCallbacks *)0x0);
  local_f8.m_data.deleter.m_device = local_c8.m_data.deleter.m_device;
  local_f8.m_data.deleter.m_allocator = local_c8.m_data.deleter.m_allocator;
  local_f8.m_data.object.m_internal = local_c8.m_data.object.m_internal;
  local_f8.m_data.deleter.m_deviceIface = local_c8.m_data.deleter.m_deviceIface;
  local_c8.m_data.object.m_internal = 0;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_f8.m_data.deleter.m_device;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_f8.m_data.deleter.m_allocator;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_f8.m_data.object.m_internal;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = local_f8.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_c8);
  return;
}

Assistant:

void BasicGraphicsTestInstance::buildFrameBuffer(tcu::UVec2 renderSize, VkFormat colorFormat, VkFormat depthFormat)
{
	const DeviceInterface&      vk                   = m_context.getDeviceInterface();
	const VkDevice              vkDevice             = m_context.getDevice();
	const VkComponentMapping    ComponentMappingRGBA = { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A};

	// Create color image
	{
		m_colorImage = createImage2DAndBindMemory(colorFormat,
												  renderSize.x(),
												  renderSize.y(),
												  VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
												  VK_SAMPLE_COUNT_1_BIT,
												  &m_colorImageAlloc);
	}

	// Create depth image
	{
		m_depthImage = createImage2DAndBindMemory(depthFormat,
												  renderSize.x(),
												  renderSize.y(),
												  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
												  VK_SAMPLE_COUNT_1_BIT,
												  &m_depthImageAlloc);
	}

	// Set up image layout transition barriers
	{
		const VkImageMemoryBarrier colorImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_colorImage,										// VkImage					image;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};
		const VkImageMemoryBarrier depthImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_depthImage,										// VkImage					image;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[0] = colorImageBarrier;
		m_imageLayoutBarriers[1] = depthImageBarrier;
	}

	// Create color attachment view
	{
		const VkImageViewCreateInfo colorAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_colorImage,                                  // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			colorFormat,                                    // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_colorAttachmentView = createImageView(vk, vkDevice, &colorAttachmentViewParams);
	}

	// Create depth attachment view
	{
		const VkImageViewCreateInfo depthAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_depthImage,                                  // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			depthFormat,                                    // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_depthAttachmentView = createImageView(vk, vkDevice, &depthAttachmentViewParams);
	}

	// Create framebuffer
	{
		const VkImageView attachmentBindInfos[2] =
		{
			*m_colorAttachmentView,
			*m_depthAttachmentView,
		};

		const VkFramebufferCreateInfo framebufferParams =
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,          // VkStructureType              sType;
			DE_NULL,                                            // const void*                  pNext;
			0u,                                                 // VkFramebufferCreateFlags     flags;
			*m_renderPass,                                      // VkRenderPass                 renderPass;
			2u,                                                 // deUint32                     attachmentCount;
			attachmentBindInfos,                                // const VkImageView*           pAttachments;
			(deUint32)renderSize.x(),                           // deUint32                     width;
			(deUint32)renderSize.y(),                           // deUint32                     height;
			1u,                                                 // deUint32                     layers;
		};

		m_framebuffer = createFramebuffer(vk, vkDevice, &framebufferParams);
	}

}